

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall
EventLoopThreadPool::EventLoopThreadPool
          (EventLoopThreadPool *this,EventLoop *baseLoop,int numThreads)

{
  LogStream *this_00;
  Logger local_ff8;
  int local_1c;
  EventLoop *pEStack_18;
  int numThreads_local;
  EventLoop *baseLoop_local;
  EventLoopThreadPool *this_local;
  
  local_1c = numThreads;
  pEStack_18 = baseLoop;
  baseLoop_local = (EventLoop *)this;
  noncopyable::noncopyable((noncopyable *)this);
  this->baseLoop_ = pEStack_18;
  this->started_ = false;
  this->numThreads_ = local_1c;
  this->next_ = 0;
  std::vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
  ::vector(&this->threads_);
  std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::vector(&this->loops_);
  if (this->numThreads_ < 1) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoopThreadPool.cpp"
                   ,8);
    this_00 = Logger::stream(&local_ff8);
    LogStream::operator<<(this_00,"numThreads_ <= 0");
    Logger::~Logger(&local_ff8);
    abort();
  }
  return;
}

Assistant:

EventLoopThreadPool::EventLoopThreadPool(EventLoop* baseLoop, int numThreads)
    : baseLoop_(baseLoop), started_(false), numThreads_(numThreads), next_(0) {
    if (numThreads_ <= 0) {
    LOG << "numThreads_ <= 0";
    abort();
    }
}